

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

FUNCTION_RETURN generate_user_pc_signature(char *identifier_out,IDENTIFICATION_STRATEGY strategy)

{
  uint local_fc;
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uint local_2c;
  PcIdentifier *pauStack_28;
  uint req_buffer_size;
  PcIdentifier *identifiers;
  FUNCTION_RETURN result;
  IDENTIFICATION_STRATEGY strategy_local;
  char *identifier_out_local;
  
  local_2c = 0;
  identifiers._4_4_ = strategy;
  _result = identifier_out;
  identifiers._0_4_ = generate_pc_id((PcIdentifier *)0x0,&local_2c,strategy);
  identifier_out_local._4_4_ = (FUNCTION_RETURN)identifiers;
  if ((FUNCTION_RETURN)identifiers == FUNC_RET_OK) {
    if (local_2c == 0) {
      identifier_out_local._4_4_ = FUNC_RET_ERROR;
    }
    else {
      if (local_2c < 2) {
        local_fc = 2;
      }
      else {
        local_fc = local_2c;
      }
      local_2c = local_fc;
      pauStack_28 = (PcIdentifier *)malloc((ulong)local_fc * 6);
      memset(pauStack_28,0,(ulong)local_2c * 6);
      identifiers._0_4_ = generate_pc_id(pauStack_28,&local_2c,identifiers._4_4_);
      if ((FUNCTION_RETURN)identifiers == FUNC_RET_OK) {
        identifiers._0_4_ = encode_pc_id(*pauStack_28,pauStack_28[1],_result);
        free(pauStack_28);
        identifier_out_local._4_4_ = (FUNCTION_RETURN)identifiers;
      }
      else {
        free(pauStack_28);
        identifier_out_local._4_4_ = (FUNCTION_RETURN)identifiers;
      }
    }
  }
  return identifier_out_local._4_4_;
}

Assistant:

FUNCTION_RETURN generate_user_pc_signature(PcSignature identifier_out,
		IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	PcIdentifier* identifiers;
	unsigned int req_buffer_size = 0;
	result = generate_pc_id(NULL, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		return result;
	}
	if (req_buffer_size == 0) {
		return FUNC_RET_ERROR;
	}
	req_buffer_size = req_buffer_size < 2 ? 2 : req_buffer_size;
	identifiers = (PcIdentifier *) malloc(
			sizeof(PcIdentifier) * req_buffer_size);
	memset(identifiers, 0, sizeof(PcIdentifier) * req_buffer_size);
	result = generate_pc_id(identifiers, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		free(identifiers);
		return result;
	}
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[0]);
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[1]);
#endif
	result = encode_pc_id(identifiers[0], identifiers[1], identifier_out);
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifier_out);
#endif
	free(identifiers);
	return result;
}